

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enet.h
# Opt level: O1

ENetHost *
enet_host_create(ENetAddress *address,size_t peerCount,size_t channelLimit,
                uint32_t incomingBandwidth,uint32_t outgoingBandwidth,int bufferSize)

{
  undefined8 uVar1;
  undefined2 uVar2;
  int iVar3;
  int iVar4;
  ENetHost *pEVar5;
  ENetPeer *pEVar6;
  ENetPeer *pEVar7;
  long lVar8;
  uint uVar9;
  ENetPeer *pEVar10;
  size_t sVar11;
  long lVar12;
  timeval timeVal;
  timeval local_48;
  size_t local_38;
  
  if (peerCount < 0x1000) {
    local_38 = channelLimit;
    pEVar5 = (ENetHost *)(*(code *)callbacks_0)(0x2b10);
    if (pEVar5 == (ENetHost *)0x0) {
      pEVar5 = (ENetHost *)(*(code *)callbacks_2)();
      return pEVar5;
    }
    memset(pEVar5,0,0x2b10);
    pEVar6 = (ENetPeer *)(*(code *)callbacks_0)(peerCount * 0x1e8);
    if (pEVar6 == (ENetPeer *)0x0) {
      pEVar5 = (ENetHost *)(*(code *)callbacks_2)();
      return pEVar5;
    }
    pEVar5->peers = pEVar6;
    if (pEVar6 != (ENetPeer *)0x0) {
      memset(pEVar6,0,peerCount * 0x1e8);
      iVar3 = socket(10,0x80002,0);
      pEVar5->socket = iVar3;
      if (iVar3 != -1) {
        local_48.tv_sec._0_4_ = 0;
        setsockopt(iVar3,0x29,0x1a,&local_48,4);
      }
      iVar4 = enet_socket_bind(pEVar5->socket,address);
      iVar3 = pEVar5->socket;
      if (iVar3 != -1) {
        if ((address == (ENetAddress *)0x0) || (-1 < iVar4)) {
          iVar4 = 0x40000;
          if (0x40000 < bufferSize) {
            iVar4 = bufferSize;
          }
          if (0xfffff < iVar4) {
            iVar4 = 0x100000;
          }
          enet_socket_set_option(iVar3,ENET_SOCKOPT_NONBLOCK,1);
          local_48.tv_sec._0_4_ = 1;
          setsockopt(pEVar5->socket,1,6,&local_48,4);
          local_48.tv_sec._0_4_ = iVar4;
          setsockopt(pEVar5->socket,1,8,&local_48,4);
          local_48.tv_sec._0_4_ = iVar4;
          setsockopt(pEVar5->socket,1,7,&local_48,4);
          if (address != (ENetAddress *)0x0) {
            iVar3 = enet_socket_get_address(pEVar5->socket,&pEVar5->address);
            if (iVar3 < 0) {
              uVar2 = *(undefined2 *)&address->field_0x12;
              (pEVar5->address).port = address->port;
              *(undefined2 *)&(pEVar5->address).field_0x12 = uVar2;
              uVar1 = *(undefined8 *)((long)&address->field_0 + 8);
              *(undefined8 *)&(pEVar5->address).field_0 = *(undefined8 *)&address->field_0;
              *(undefined8 *)((long)&(pEVar5->address).field_0 + 8) = uVar1;
            }
          }
          sVar11 = 0xff;
          if (0xffffffffffffff00 < local_38 - 0x100) {
            sVar11 = local_38;
          }
          pEVar5->randomSeed = (uint32_t)pEVar5;
          gettimeofday(&local_48,(__timezone_ptr_t)0x0);
          uVar9 = ((int)(SUB168(SEXT816(0x20c49ba5e353f7cf) * SEXT816(local_48.tv_usec),8) >> 7) -
                   (SUB164(SEXT816(0x20c49ba5e353f7cf) * SEXT816(local_48.tv_usec),0xc) >> 0x1f) ^
                  (int)local_48.tv_sec * 1000) + pEVar5->randomSeed;
          pEVar5->randomSeed = uVar9 * 0x10000 | uVar9 >> 0x10;
          pEVar5->channelLimit = sVar11;
          pEVar5->incomingBandwidth = incomingBandwidth;
          pEVar5->outgoingBandwidth = outgoingBandwidth;
          pEVar5->bandwidthThrottleEpoch = 0;
          pEVar5->recalculateBandwidthLimits = 0;
          pEVar5->preventConnections = '\0';
          pEVar5->mtu = 0x500;
          pEVar5->peerCount = peerCount;
          pEVar5->commandCount = 0;
          pEVar5->bufferCount = 0;
          pEVar5->checksumCallback = (ENetChecksumCallback)0x0;
          uVar1 = _setsockopt;
          *(undefined8 *)&(pEVar5->receivedAddress).field_0 = _in6addr_any;
          *(undefined8 *)((long)&(pEVar5->receivedAddress).field_0 + 8) = uVar1;
          (pEVar5->receivedAddress).port = 0;
          pEVar5->totalSentData = 0;
          pEVar5->totalSentPackets = 0;
          pEVar5->totalReceivedData = 0;
          pEVar5->totalReceivedPackets = 0;
          pEVar5->receivedData = (uint8_t *)0x0;
          pEVar5->receivedDataLength = 0;
          pEVar5->connectedPeers = 0;
          pEVar5->bandwidthLimitedPeers = 0;
          pEVar5->duplicatePeers = 0xfff;
          pEVar5->maximumPacketSize = 0x2000000;
          pEVar5->maximumWaitingData = 0x2000000;
          pEVar5->interceptCallback = (ENetInterceptCallback)0x0;
          (pEVar5->dispatchQueue).sentinel.next = &(pEVar5->dispatchQueue).sentinel;
          (pEVar5->dispatchQueue).sentinel.previous = &(pEVar5->dispatchQueue).sentinel;
          if ((long)peerCount < 1) {
            return pEVar5;
          }
          pEVar6 = pEVar5->peers;
          lVar12 = 0;
          pEVar7 = pEVar6;
          do {
            pEVar10 = (ENetPeer *)((long)&(pEVar6->dispatchList).next + lVar12);
            lVar8 = (long)pEVar6->unsequencedWindow + lVar12 + -0x58;
            *(ENetHost **)((long)&pEVar6->host + lVar12) = pEVar5;
            *(short *)((long)&pEVar6->incomingPeerID + lVar12) =
                 (short)((uint)((int)pEVar10 - (int)pEVar7) >> 3) * -0x68eb;
            *(undefined2 *)(&pEVar6->outgoingSessionID + lVar12) = 0xffff;
            *(undefined8 *)((long)&pEVar6->data + lVar12) = 0;
            *(long *)lVar8 = lVar8;
            *(long *)((long)pEVar6->unsequencedWindow + lVar12 + -0x50) = lVar8;
            lVar8 = (long)pEVar6->unsequencedWindow + lVar12 + -0x48;
            *(long *)lVar8 = lVar8;
            *(long *)(lVar8 + 8) = lVar8;
            lVar8 = (long)pEVar6->unsequencedWindow + lVar12 + -0x38;
            *(long *)lVar8 = lVar8;
            *(long *)(lVar8 + 8) = lVar8;
            lVar8 = (long)pEVar6->unsequencedWindow + lVar12 + -0x28;
            *(long *)lVar8 = lVar8;
            *(long *)(lVar8 + 8) = lVar8;
            lVar8 = (long)pEVar6->unsequencedWindow + lVar12 + -0x18;
            *(long *)lVar8 = lVar8;
            *(long *)((long)pEVar6->unsequencedWindow + lVar12 + -0x10) = lVar8;
            enet_peer_reset(pEVar10);
            pEVar7 = pEVar5->peers;
            pEVar10 = (ENetPeer *)((long)&pEVar6[1].dispatchList.next + lVar12);
            lVar12 = lVar12 + 0x1e8;
          } while (pEVar10 < pEVar7 + pEVar5->peerCount);
          return pEVar5;
        }
        if (iVar3 != -1) {
          close(iVar3);
        }
      }
      (*(code *)callbacks_1)(pEVar5->peers);
    }
    (*(code *)callbacks_1)(pEVar5);
  }
  return (ENetHost *)0x0;
}

Assistant:

ENetHost* enet_host_create(const ENetAddress* address, size_t peerCount, size_t channelLimit, uint32_t incomingBandwidth, uint32_t outgoingBandwidth, int bufferSize) {
	ENetHost* host;
	ENetPeer* currentPeer;

	ENET_LOG_TRACE("Creating ENet host object.");

	if (peerCount > ENET_PROTOCOL_MAXIMUM_PEER_ID) {
		ENET_LOG_ERROR("Creation failure: Peer count greater than maximum allowed (%u)", ENET_PROTOCOL_MAXIMUM_PEER_ID);
		return NULL;
	}

	host = (ENetHost*)enet_malloc(sizeof(ENetHost));

	if (host == NULL) {
		ENET_LOG_ERROR("Creation failure: Memory allocation failure. Wanted %u bytes", sizeof(ENetHost));
		return NULL;
	}

	memset(host, 0, sizeof(ENetHost));

	host->peers = (ENetPeer*)enet_malloc(peerCount * sizeof(ENetPeer));

	if (host->peers == NULL) {
		ENET_LOG_ERROR("Creation failure: Peer array memory allocation failure. Wanted %u bytes", peerCount * sizeof(ENetHost));
		enet_free(host);

		return NULL;
	}

	memset(host->peers, 0, peerCount * sizeof(ENetPeer));

	host->socket = enet_socket_create(ENET_SOCKET_TYPE_DATAGRAM);

	if (host->socket != ENET_SOCKET_NULL) {
		ENET_LOG_TRACE("Socket creation: IPv4 & IPv6 dual stack mode");
		enet_socket_set_option(host->socket, ENET_SOCKOPT_IPV6_V6ONLY, 0);
	}

	int bindResult = enet_socket_bind(host->socket, address);

	if (host->socket == ENET_SOCKET_NULL || (address != NULL && bindResult < 0)) {
		if (host->socket != ENET_SOCKET_NULL) {
			ENET_LOG_TRACE("Socket creation: Cleaning up a old socket.");
			enet_socket_destroy(host->socket);
		}

		ENET_LOG_ERROR("Socket creation: Binding to socket failed with error code %i", bindResult);
		enet_free(host->peers);
		enet_free(host);

		return NULL;
	}

	ENET_LOG_TRACE("Buffers: Setting up");
	if (bufferSize > ENET_HOST_BUFFER_SIZE_MAX)
		bufferSize = ENET_HOST_BUFFER_SIZE_MAX;
	else if (bufferSize < ENET_HOST_BUFFER_SIZE_MIN)
		bufferSize = ENET_HOST_BUFFER_SIZE_MIN;

	ENET_LOG_TRACE("Socket: Setting up options");
	enet_socket_set_option(host->socket, ENET_SOCKOPT_NONBLOCK, 1);
	enet_socket_set_option(host->socket, ENET_SOCKOPT_BROADCAST, 1);
	enet_socket_set_option(host->socket, ENET_SOCKOPT_RCVBUF, bufferSize);
	enet_socket_set_option(host->socket, ENET_SOCKOPT_SNDBUF, bufferSize);

	ENET_LOG_TRACE("Address: Setting up");
	if (address != NULL && enet_socket_get_address(host->socket, &host->address) < 0)
		host->address = *address;

	ENET_LOG_TRACE("Channels: Setting up");
	if (!channelLimit || channelLimit > ENET_PROTOCOL_MAXIMUM_CHANNEL_COUNT)
		channelLimit = ENET_PROTOCOL_MAXIMUM_CHANNEL_COUNT;
	else if (channelLimit < ENET_PROTOCOL_MINIMUM_CHANNEL_COUNT)
		channelLimit = ENET_PROTOCOL_MINIMUM_CHANNEL_COUNT;

	host->randomSeed = (uint32_t)(size_t)host;
	host->randomSeed += enet_host_random_seed();
	host->randomSeed = (host->randomSeed << 16) | (host->randomSeed >> 16);
	host->channelLimit = channelLimit;
	host->incomingBandwidth = incomingBandwidth;
	host->outgoingBandwidth = outgoingBandwidth;
	host->bandwidthThrottleEpoch = 0;
	host->recalculateBandwidthLimits = 0;
	host->preventConnections = 0;
	host->mtu = ENET_HOST_DEFAULT_MTU;
	host->peerCount = peerCount;
	host->commandCount = 0;
	host->bufferCount = 0;
	host->checksumCallback = NULL;
	host->receivedAddress.ipv6 = ENET_HOST_ANY;
	host->receivedAddress.port = 0;
	host->receivedData = NULL;
	host->receivedDataLength = 0;
	host->totalSentData = 0;
	host->totalSentPackets = 0;
	host->totalReceivedData = 0;
	host->totalReceivedPackets = 0;
	host->connectedPeers = 0;
	host->bandwidthLimitedPeers = 0;
	host->duplicatePeers = ENET_PROTOCOL_MAXIMUM_PEER_ID;
	host->maximumPacketSize = ENET_HOST_DEFAULT_MAXIMUM_PACKET_SIZE;
	host->maximumWaitingData = ENET_HOST_DEFAULT_MAXIMUM_WAITING_DATA;
	host->interceptCallback = NULL;

	ENET_LOG_TRACE("Startup: Clearing queues");
	enet_list_clear(&host->dispatchQueue);

	for (currentPeer = host->peers; currentPeer < &host->peers[host->peerCount]; ++currentPeer) {
		currentPeer->host = host;
		currentPeer->incomingPeerID = currentPeer - host->peers;
		currentPeer->outgoingSessionID = currentPeer->incomingSessionID = 0xFF;
		currentPeer->data = NULL;

		enet_list_clear(&currentPeer->acknowledgements);
		enet_list_clear(&currentPeer->sentReliableCommands);
		enet_list_clear(&currentPeer->sentUnreliableCommands);
		enet_list_clear(&currentPeer->outgoingCommands);
		enet_list_clear(&currentPeer->dispatchedCommands);
		enet_peer_reset(currentPeer);
	}

	ENET_LOG_TRACE("Startup: Complete. Let's do this.");
	return host;
}